

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

bool __thiscall cmCTestTestHandler::ProcessOptions(cmCTestTestHandler *this)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  Repeat RVar4;
  cmValue cVar5;
  ostream *poVar6;
  char *extraout_RDX;
  char *extraout_RDX_00;
  undefined8 uVar7;
  char *extraout_RDX_01;
  _Storage<unsigned_long,_true> op;
  cmCTest *pcVar8;
  string_view value;
  string_view value_00;
  optional<unsigned_long> level;
  string_view value_01;
  unsigned_long plevel;
  unsigned_long n;
  RegularExpression repeatRegex;
  ostringstream cmCTestLog_msg;
  _Storage<unsigned_long,_true> local_3f8;
  undefined8 local_3f0;
  undefined1 local_3e8 [24];
  undefined1 local_3d0 [112];
  ios_base local_360 [152];
  char *local_2c8;
  char *local_2c0;
  char *local_1c0;
  char *local_1b0;
  int local_1a8;
  undefined1 local_1a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [6];
  ios_base local_130 [264];
  
  pcVar1 = local_3d0 + 0x10;
  local_3d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"TestsToRunInformation","");
  cVar5 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_3d0);
  SetTestsToRunInformation(this,cVar5);
  if ((pointer)local_3d0._0_8_ != pcVar1) {
    operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
  }
  local_3d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"UseUnion","");
  cVar5 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_3d0);
  if (cVar5.Value == (string *)0x0) {
    bVar2 = false;
  }
  else {
    value._M_str = extraout_RDX;
    value._M_len = (size_t)((cVar5.Value)->_M_dataplus)._M_p;
    bVar2 = cmValue::IsOn((cmValue *)(cVar5.Value)->_M_string_length,value);
  }
  this->UseUnion = bVar2;
  if ((pointer)local_3d0._0_8_ != pcVar1) {
    operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
  }
  local_3d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"ScheduleRandom","");
  cVar5 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_3d0);
  if (cVar5.Value == (string *)0x0) {
    bVar2 = false;
  }
  else {
    value_00._M_str = extraout_RDX_00;
    value_00._M_len = (size_t)((cVar5.Value)->_M_dataplus)._M_p;
    bVar2 = cmValue::IsOn((cmValue *)(cVar5.Value)->_M_string_length,value_00);
  }
  if ((pointer)local_3d0._0_8_ != pcVar1) {
    operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
  }
  if (bVar2 != false) {
    pcVar8 = (this->super_cmCTestGenericHandler).CTest;
    local_3d0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"Random","");
    cmCTest::SetScheduleType(pcVar8,(string *)local_3d0);
    if ((pointer)local_3d0._0_8_ != pcVar1) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
  }
  local_3d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"Repeat","");
  cVar5 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_3d0);
  if ((pointer)local_3d0._0_8_ != pcVar1) {
    operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
  }
  if (cVar5.Value == (string *)0x0) {
LAB_0020ab32:
    local_3d0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"ParallelLevel","");
    op._M_value = (unsigned_long)local_3d0;
    cVar5 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)op);
    if ((pointer)local_3d0._0_8_ != pcVar1) {
      op._M_value = local_3d0._16_8_ + 1;
      operator_delete((void *)local_3d0._0_8_,op._M_value);
    }
    if (cVar5.Value != (string *)0x0) {
      if ((cVar5.Value)->_M_string_length == 0) {
        pcVar8 = (this->super_cmCTestGenericHandler).CTest;
        uVar7 = 0;
      }
      else {
        local_3f8._M_value = 0;
        bVar2 = cmStrToULong(cVar5.Value,&local_3f8._M_value);
        if (!bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0,"ParallelLevel invalid value: ",0x1d);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_3d0,((cVar5.Value)->_M_dataplus)._M_p,
                              (cVar5.Value)->_M_string_length);
          std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          pcVar8 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar8,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                       ,0x233,(char *)local_1a0._0_8_,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._0_8_ != local_190) {
            operator_delete((void *)local_1a0._0_8_,
                            CONCAT71(local_190[0]._M_allocated_capacity._1_7_,
                                     local_190[0]._M_local_buf[0]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d0);
          std::ios_base::~ios_base(local_360);
          goto LAB_0020b0db;
        }
        pcVar8 = (this->super_cmCTestGenericHandler).CTest;
        uVar7 = 1;
        op = local_3f8;
      }
      level.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._8_8_ = uVar7;
      level.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value = op._M_value;
      cmCTest::SetParallelLevel(pcVar8,level);
    }
    local_3d0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"StopOnFailure","");
    cVar5 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_3d0)
    ;
    if ((pointer)local_3d0._0_8_ != pcVar1) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    if (cVar5.Value != (string *)0x0) {
      cmCTest::SetStopOnFailure((this->super_cmCTestGenericHandler).CTest,true);
    }
    local_3d0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"LabelRegularExpression","")
    ;
    cmCTestGenericHandler::GetMultiOption
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1a0,&this->super_cmCTestGenericHandler,(string *)local_3d0);
    BuildLabelRE((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1a0,&this->IncludeLabelRegularExpressions);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1a0);
    if ((pointer)local_3d0._0_8_ != pcVar1) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    local_3d0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d0,"ExcludeLabelRegularExpression","");
    cmCTestGenericHandler::GetMultiOption
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1a0,&this->super_cmCTestGenericHandler,(string *)local_3d0);
    BuildLabelRE((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1a0,&this->ExcludeLabelRegularExpressions);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1a0);
    if ((pointer)local_3d0._0_8_ != pcVar1) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    local_3d0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d0,"IncludeRegularExpression","");
    cVar5 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_3d0)
    ;
    if ((pointer)local_3d0._0_8_ != pcVar1) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    if (cVar5.Value != (string *)0x0) {
      this->UseIncludeRegExpFlag = true;
      std::__cxx11::string::_M_assign((string *)&this->IncludeRegExp);
    }
    local_3d0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d0,"ExcludeRegularExpression","");
    cVar5 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_3d0)
    ;
    if ((pointer)local_3d0._0_8_ != pcVar1) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    if (cVar5.Value != (string *)0x0) {
      this->UseExcludeRegExpFlag = true;
      this->UseExcludeRegExpFirst = (bool)(this->UseIncludeRegExpFlag ^ 1);
      std::__cxx11::string::_M_assign((string *)&this->ExcludeRegExp);
    }
    local_3d0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d0,"ExcludeFixtureRegularExpression","");
    cVar5 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_3d0)
    ;
    if ((pointer)local_3d0._0_8_ != pcVar1) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    if (cVar5.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->ExcludeFixtureRegExp);
    }
    local_3d0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d0,"ExcludeFixtureSetupRegularExpression","");
    cVar5 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_3d0)
    ;
    if ((pointer)local_3d0._0_8_ != pcVar1) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    if (cVar5.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->ExcludeFixtureSetupRegExp);
    }
    local_3d0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d0,"ExcludeFixtureCleanupRegularExpression","");
    cVar5 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_3d0)
    ;
    if ((pointer)local_3d0._0_8_ != pcVar1) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    if (cVar5.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->ExcludeFixtureCleanupRegExp);
    }
    local_3d0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"ResourceSpecFile","");
    cVar5 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_3d0)
    ;
    if ((pointer)local_3d0._0_8_ != pcVar1) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    if (cVar5.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->ResourceSpecFile);
    }
    local_3d0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"TestListFile","");
    cVar5 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_3d0)
    ;
    if ((pointer)local_3d0._0_8_ != pcVar1) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    if (cVar5.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->TestListFile);
    }
    local_3d0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"ExcludeTestListFile","");
    cVar5 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_3d0)
    ;
    if ((pointer)local_3d0._0_8_ != pcVar1) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    if (cVar5.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->ExcludeTestListFile);
    }
    local_3d0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"RerunFailed","");
    cVar5 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_3d0)
    ;
    if (cVar5.Value == (string *)0x0) {
      bVar2 = false;
    }
    else {
      value_01._M_str = extraout_RDX_01;
      value_01._M_len = (size_t)((cVar5.Value)->_M_dataplus)._M_p;
      bVar2 = cmValue::IsOn((cmValue *)(cVar5.Value)->_M_string_length,value_01);
    }
    this->RerunFailed = bVar2;
    if ((pointer)local_3d0._0_8_ != pcVar1) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    bVar2 = true;
  }
  else {
    local_1c0 = (char *)0x0;
    local_1b0 = (char *)0x0;
    local_1a8 = 0;
    memset((RegularExpression *)local_3d0,0,0x20a);
    cmsys::RegularExpression::compile
              ((RegularExpression *)local_3d0,"^(UNTIL_FAIL|UNTIL_PASS|AFTER_TIMEOUT):([0-9]+)$");
    bVar2 = cmsys::RegularExpression::find
                      ((RegularExpression *)local_3d0,((cVar5.Value)->_M_dataplus)._M_p,
                       (RegularExpressionMatch *)local_3d0);
    if (bVar2) {
      if (local_3d0._16_8_ == 0) {
        local_1a0._0_8_ = local_190;
        local_1a0._8_8_ = (pointer)0x0;
        local_190[0]._M_local_buf[0] = '\0';
      }
      else {
        local_1a0._0_8_ = local_190;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a0,local_3d0._16_8_,local_2c0);
      }
      local_3e8._16_8_ = 1;
      cmStrToULong((string *)local_1a0,(unsigned_long *)(local_3e8 + 0x10));
      this->RepeatCount = local_3e8._16_4_;
      if (1 < (int)local_3e8._16_4_) {
        if ((char *)local_3d0._8_8_ == (char *)0x0) {
          local_3f8._M_value = (unsigned_long)local_3e8;
          local_3f0 = 0;
          local_3e8[0] = 0;
        }
        else {
          local_3f8._M_value = (unsigned_long)local_3e8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3f8,local_3d0._8_8_,local_2c8);
        }
        iVar3 = std::__cxx11::string::compare((char *)&local_3f8._M_value);
        if (iVar3 == 0) {
          RVar4 = UntilFail;
LAB_0020aad5:
          this->RepeatMode = RVar4;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&local_3f8._M_value);
          if (iVar3 == 0) {
            RVar4 = UntilPass;
            goto LAB_0020aad5;
          }
          iVar3 = std::__cxx11::string::compare((char *)&local_3f8._M_value);
          if (iVar3 == 0) {
            RVar4 = AfterTimeout;
            goto LAB_0020aad5;
          }
        }
        if ((string *)local_3f8._M_value != (string *)local_3e8) {
          operator_delete((void *)local_3f8,CONCAT71(local_3e8._1_7_,local_3e8[0]) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._0_8_ != local_190) {
        operator_delete((void *)local_1a0._0_8_,
                        CONCAT71(local_190[0]._M_allocated_capacity._1_7_,
                                 local_190[0]._M_local_buf[0]) + 1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"Repeat option invalid value: ",0x1d);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a0,((cVar5.Value)->_M_dataplus)._M_p,
                          (cVar5.Value)->_M_string_length);
      std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      pcVar8 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar8,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x225,(char *)local_3f8,false);
      if ((string *)local_3f8._M_value != (string *)local_3e8) {
        operator_delete((void *)local_3f8,CONCAT71(local_3e8._1_7_,local_3e8[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
      std::ios_base::~ios_base(local_130);
    }
    if (local_1b0 != (char *)0x0) {
      operator_delete__(local_1b0);
    }
    if (bVar2) goto LAB_0020ab32;
LAB_0020b0db:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool cmCTestTestHandler::ProcessOptions()
{
  // Update internal data structure from generic one
  this->SetTestsToRunInformation(this->GetOption("TestsToRunInformation"));
  this->SetUseUnion(this->GetOption("UseUnion").IsOn());
  if (this->GetOption("ScheduleRandom").IsOn()) {
    this->CTest->SetScheduleType("Random");
  }
  if (cmValue repeat = this->GetOption("Repeat")) {
    cmsys::RegularExpression repeatRegex(
      "^(UNTIL_FAIL|UNTIL_PASS|AFTER_TIMEOUT):([0-9]+)$");
    if (repeatRegex.find(*repeat)) {
      std::string const& count = repeatRegex.match(2);
      unsigned long n = 1;
      cmStrToULong(count, &n); // regex guarantees success
      this->RepeatCount = static_cast<int>(n);
      if (this->RepeatCount > 1) {
        std::string const& mode = repeatRegex.match(1);
        if (mode == "UNTIL_FAIL") {
          this->RepeatMode = cmCTest::Repeat::UntilFail;
        } else if (mode == "UNTIL_PASS") {
          this->RepeatMode = cmCTest::Repeat::UntilPass;
        } else if (mode == "AFTER_TIMEOUT") {
          this->RepeatMode = cmCTest::Repeat::AfterTimeout;
        }
      }
    } else {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Repeat option invalid value: " << *repeat << std::endl);
      return false;
    }
  }
  if (cmValue parallelLevel = this->GetOption("ParallelLevel")) {
    if (parallelLevel.IsEmpty()) {
      // An empty value tells ctest to choose a default.
      this->CTest->SetParallelLevel(cm::nullopt);
    } else {
      // A non-empty value must be a non-negative integer.
      unsigned long plevel = 0;
      if (!cmStrToULong(*parallelLevel, &plevel)) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "ParallelLevel invalid value: " << *parallelLevel
                                                   << std::endl);
        return false;
      }
      this->CTest->SetParallelLevel(plevel);
    }
  }

  if (this->GetOption("StopOnFailure")) {
    this->CTest->SetStopOnFailure(true);
  }

  BuildLabelRE(this->GetMultiOption("LabelRegularExpression"),
               this->IncludeLabelRegularExpressions);
  BuildLabelRE(this->GetMultiOption("ExcludeLabelRegularExpression"),
               this->ExcludeLabelRegularExpressions);
  cmValue val = this->GetOption("IncludeRegularExpression");
  if (val) {
    this->UseIncludeRegExp();
    this->SetIncludeRegExp(*val);
  }
  val = this->GetOption("ExcludeRegularExpression");
  if (val) {
    this->UseExcludeRegExp();
    this->SetExcludeRegExp(*val);
  }
  val = this->GetOption("ExcludeFixtureRegularExpression");
  if (val) {
    this->ExcludeFixtureRegExp = *val;
  }
  val = this->GetOption("ExcludeFixtureSetupRegularExpression");
  if (val) {
    this->ExcludeFixtureSetupRegExp = *val;
  }
  val = this->GetOption("ExcludeFixtureCleanupRegularExpression");
  if (val) {
    this->ExcludeFixtureCleanupRegExp = *val;
  }
  val = this->GetOption("ResourceSpecFile");
  if (val) {
    this->ResourceSpecFile = *val;
  }
  val = this->GetOption("TestListFile");
  if (val) {
    this->TestListFile = val;
  }
  val = this->GetOption("ExcludeTestListFile");
  if (val) {
    this->ExcludeTestListFile = val;
  }
  this->SetRerunFailed(this->GetOption("RerunFailed").IsOn());

  return true;
}